

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadable_extension_demo.cpp
# Opt level: O0

void loadable_extension_demo_init(DatabaseInstance *db)

{
  ScalarFunction SVar1;
  ScalarFunction SVar2;
  ScalarFunction SVar3;
  ScalarFunction SVar4;
  ScalarFunction SVar5;
  ScalarFunction SVar6;
  ScalarFunction SVar7;
  ScalarFunction SVar8;
  ScalarFunction SVar9;
  ScalarFunction SVar10;
  TableFunction TVar11;
  initializer_list<duckdb::LogicalType> iVar12;
  initializer_list<duckdb::LogicalType> iVar13;
  initializer_list<duckdb::LogicalType> iVar14;
  initializer_list<duckdb::LogicalType> iVar15;
  initializer_list<duckdb::LogicalType> iVar16;
  initializer_list<duckdb::LogicalType> iVar17;
  initializer_list<duckdb::LogicalType> iVar18;
  initializer_list<duckdb::LogicalType> iVar19;
  initializer_list<duckdb::LogicalType> iVar20;
  ClientContext *pCVar21;
  CreateFunctionInfo *pCVar22;
  DatabaseInstance *pDVar23;
  pointer pCVar24;
  mapped_type *pmVar25;
  DatabaseInstance *in_RDI;
  LogicalType *this;
  pair<const_char_*,_duckdb::LogicalTypeId> pVar26;
  LogicalType minmax_type;
  ScalarFunction bounded_to_ascii;
  LogicalType bounded_specialized_type;
  ScalarFunction bounded_even;
  ScalarFunction bounded_add;
  ScalarFunction bounded_invert;
  ScalarFunction bounded_max;
  LogicalType bounded_type;
  DBConfig *config;
  CreateTableFunctionInfo quack_info;
  QuackFunction quack_function;
  CreateScalarFunctionInfo loaded_extensions_info;
  ScalarFunction loaded_extensions;
  optional_ptr<duckdb::CatalogEntry,_true> sub_point_entry;
  CreateScalarFunctionInfo sub_point_info;
  ScalarFunction sub_point_func;
  optional_ptr<duckdb::CatalogEntry,_true> add_point_entry;
  CreateScalarFunctionInfo add_point_info;
  ScalarFunction add_point_func;
  optional_ptr<duckdb::CatalogEntry,_true> type_entry;
  LogicalType target_type;
  templated_unique_single_t alias_info;
  child_list_t<LogicalType> child_types;
  string alias_name;
  Catalog *catalog;
  ClientContext *client_context;
  Connection con;
  CreateScalarFunctionInfo hello_alias_info;
  value_type *__x;
  allocator_type *paVar27;
  key_type *__k;
  value_type *__x_00;
  ScalarFunction *pSVar28;
  TableFunction *this_00;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *in_stack_ffffffffffffcd98;
  iterator pLVar29;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *__f;
  TableFunction *__f_00;
  undefined8 uVar30;
  function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
  *in_stack_ffffffffffffcda0;
  function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *pfVar31;
  TableFunction *this_01;
  LogicalType *pLVar32;
  undefined4 uVar33;
  undefined4 in_stack_ffffffffffffcdac;
  undefined4 uVar34;
  undefined4 in_stack_ffffffffffffcdb4;
  pair<const_char_*,_duckdb::LogicalTypeId> *__p;
  undefined8 uVar35;
  undefined8 uVar36;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  *in_stack_ffffffffffffcdc0;
  undefined1 in_stack_ffffffffffffcdc8 [116];
  int32_t in_stack_ffffffffffffce3c;
  undefined1 in_stack_ffffffffffffce40 [32];
  _func_int_string_t *in_stack_ffffffffffffce60;
  LogicalType *in_stack_ffffffffffffce68;
  vector<duckdb::LogicalType,_true> *in_stack_ffffffffffffce70;
  string *in_stack_ffffffffffffce78;
  Connection *in_stack_ffffffffffffce80;
  undefined1 in_stack_ffffffffffffce88 [40];
  undefined1 in_stack_ffffffffffffceb0 [120];
  undefined8 in_stack_ffffffffffffcf28;
  undefined8 in_stack_ffffffffffffcf30;
  undefined8 in_stack_ffffffffffffcf38;
  LogicalType *local_3038;
  LogicalType *local_3008;
  LogicalType *local_2fd8;
  LogicalType *local_2fa8;
  LogicalType *local_2f78;
  LogicalType *local_2ec0;
  LogicalType *local_2e50;
  LogicalType *local_2d80;
  LogicalType local_2d50 [24];
  undefined1 local_2d38 [32];
  LogicalType local_2d18 [32];
  LogicalType *local_2cf8;
  LogicalType local_2cf0 [24];
  LogicalType *local_2cd8;
  undefined8 local_2cd0;
  undefined1 local_2cc8 [31];
  allocator local_2ca9;
  string local_2ca8 [32];
  ScalarFunction local_2c88;
  undefined1 local_2b60 [8];
  BoundCastInfo local_2b58 [24];
  LogicalType local_2b40 [24];
  LogicalType local_2b28 [31];
  allocator local_2b09;
  string local_2b08 [32];
  LogicalType local_2ae8 [24];
  undefined1 local_2ad0 [8];
  BoundCastInfo local_2ac8 [24];
  LogicalType local_2ab0 [24];
  undefined1 local_2a98 [8];
  BoundCastInfo local_2a90 [320];
  function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> local_2950;
  LogicalType local_2918 [32];
  LogicalType *local_28f8;
  LogicalType local_28f0 [24];
  LogicalType *local_28d8;
  undefined8 local_28d0;
  undefined1 local_28c8 [31];
  allocator local_28a9;
  string local_28a8 [32];
  ScalarFunction local_2888;
  LogicalType local_2760 [320];
  function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> local_2620;
  LogicalType local_25e8 [32];
  LogicalType *local_25c8;
  LogicalType local_25c0 [24];
  LogicalType *local_25a8;
  undefined8 local_25a0;
  undefined1 local_2598 [31];
  allocator local_2579;
  string local_2578 [32];
  ScalarFunction local_2558 [2];
  function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> local_2308;
  LogicalType local_22d0 [32];
  LogicalType *local_22b0;
  LogicalType local_22a8 [24];
  LogicalType local_2290 [24];
  LogicalType *local_2278;
  undefined8 local_2270;
  undefined1 local_2268 [31];
  allocator local_2249;
  string local_2248 [32];
  ScalarFunction local_2228 [2];
  function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> local_1fd8;
  LogicalType local_1fa0 [32];
  LogicalType *local_1f80;
  LogicalType local_1f78 [24];
  LogicalType *local_1f60;
  undefined8 local_1f58;
  undefined1 local_1f50 [31];
  allocator local_1f31;
  string local_1f30 [32];
  ScalarFunction local_1f10 [2];
  function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> local_1cc0;
  LogicalType local_1c88 [32];
  LogicalType *local_1c68;
  LogicalType local_1c60 [24];
  LogicalType *local_1c48;
  undefined8 local_1c40;
  undefined1 local_1c38 [31];
  allocator local_1c19;
  string local_1c18 [32];
  ScalarFunction local_1bf8;
  LogicalType local_1ad0 [31];
  allocator local_1ab1;
  string local_1ab0 [32];
  LogicalType local_1a90 [72];
  undefined8 local_1a48;
  undefined8 local_1a40;
  CreateTableFunctionInfo local_1880 [880];
  undefined8 local_1510;
  CreateScalarFunctionInfo local_13e0 [440];
  undefined1 local_1228 [80];
  undefined8 local_11d8;
  undefined8 uStack_11d0;
  undefined8 local_11c8;
  allocator local_11b9;
  string local_11b8 [32];
  ScalarFunction local_1198;
  allocator local_1069;
  string local_1068 [39];
  allocator local_1041;
  string local_1040 [32];
  undefined8 local_1020;
  CreateScalarFunctionInfo local_ef0 [440];
  function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> local_d38;
  LogicalType local_d00 [32];
  LogicalType *local_ce0;
  LogicalType local_cd8 [24];
  LogicalType local_cc0 [24];
  LogicalType *local_ca8;
  undefined8 local_ca0;
  undefined1 local_c98 [31];
  allocator local_c79;
  string local_c78 [32];
  ScalarFunction local_c58;
  allocator local_b29;
  string local_b28 [39];
  allocator local_b01;
  string local_b00 [32];
  undefined8 local_ae0;
  CreateScalarFunctionInfo local_9b0 [440];
  function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> local_7f8;
  LogicalType local_7c0 [32];
  LogicalType *local_7a0;
  LogicalType local_798 [24];
  LogicalType local_780 [24];
  LogicalType *local_768;
  undefined8 local_760;
  undefined1 local_758 [31];
  allocator local_739;
  string local_738 [32];
  ScalarFunction local_718;
  allocator local_5e9;
  string local_5e8 [39];
  allocator local_5c1;
  string local_5c0 [32];
  undefined8 local_5a0;
  string local_598 [32];
  undefined1 local_578 [24];
  LogicalType local_560 [32];
  char *local_540;
  LogicalTypeId local_538;
  char *local_530;
  LogicalTypeId local_528;
  char *local_4e8;
  LogicalTypeId local_4e0;
  char *local_4d8;
  LogicalTypeId local_4d0;
  allocator local_471;
  string local_470 [32];
  undefined8 local_450;
  LogicalType local_448 [32];
  LogicalType *local_428;
  LogicalType local_420 [24];
  LogicalType *local_408;
  undefined8 local_400;
  allocator local_3d9;
  string local_3d8 [32];
  ClientContext *local_3b8;
  CreateFunctionInfo *local_3b0;
  Connection local_3a8 [32];
  function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> local_388;
  LogicalType local_350 [24];
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  allocator local_309;
  string local_308 [32];
  ScalarFunction local_2e8;
  CreateScalarFunctionInfo local_1c0 [440];
  DatabaseInstance *local_8;
  
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_308,"test_alias_hello",&local_309);
  local_338 = 0;
  uStack_330 = 0;
  local_328 = 0;
  duckdb::vector<duckdb::LogicalType,_true>::vector((vector<duckdb::LogicalType,_true> *)0x151216);
  duckdb::LogicalType::LogicalType(local_350,VARCHAR);
  std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            (in_stack_ffffffffffffcda0,in_stack_ffffffffffffcd98);
  duckdb::LogicalType::LogicalType((LogicalType *)&local_388,INVALID);
  pfVar31 = &local_388;
  __p = (pair<const_char_*,_duckdb::LogicalTypeId> *)0x0;
  uVar34 = 0;
  uVar33 = 0;
  pLVar29 = (iterator)0x0;
  pSVar28 = (ScalarFunction *)0x0;
  __x = (value_type *)0x0;
  duckdb::ScalarFunction::ScalarFunction
            (&local_2e8,local_308,&local_338,local_350,&local_388._M_invoker,0);
  SVar1._8_8_ = pSVar28;
  SVar1._0_8_ = __x;
  SVar1._16_8_ = pLVar29;
  SVar1._24_8_ = pfVar31;
  SVar1._32_4_ = uVar33;
  SVar1._36_4_ = in_stack_ffffffffffffcdac;
  SVar1._40_4_ = uVar34;
  SVar1._44_4_ = in_stack_ffffffffffffcdb4;
  SVar1._48_8_ = __p;
  SVar1._56_8_ = in_stack_ffffffffffffcdc0;
  SVar1._64_116_ = in_stack_ffffffffffffcdc8;
  SVar1.function.super__Function_base._M_functor._4_4_ = in_stack_ffffffffffffce3c;
  SVar1._184_32_ = in_stack_ffffffffffffce40;
  SVar1.bind_extended = (bind_scalar_function_extended_t)in_stack_ffffffffffffce60;
  SVar1.init_local_state = (init_local_state_t)in_stack_ffffffffffffce68;
  SVar1.statistics = (function_statistics_t)in_stack_ffffffffffffce70;
  SVar1.bind_lambda = (bind_lambda_function_t)in_stack_ffffffffffffce78;
  SVar1.bind_expression = (function_bind_expression_t)in_stack_ffffffffffffce80;
  SVar1.get_modified_databases = (get_modified_databases_t)in_stack_ffffffffffffce88._0_8_;
  SVar1.serialize = (function_serialize_t)in_stack_ffffffffffffce88._8_8_;
  SVar1.deserialize = (function_deserialize_t)in_stack_ffffffffffffce88._16_8_;
  SVar1.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2> =
       (original)(original)in_stack_ffffffffffffce88._24_16_;
  duckdb::CreateScalarFunctionInfo::CreateScalarFunctionInfo(local_1c0,SVar1);
  duckdb::ScalarFunction::~ScalarFunction(pSVar28);
  duckdb::LogicalType::~LogicalType((LogicalType *)&local_388);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::~function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             0x1512fd);
  duckdb::LogicalType::~LogicalType(local_350);
  duckdb::vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x151317);
  std::__cxx11::string::~string(local_308);
  std::allocator<char>::~allocator((allocator<char> *)&local_309);
  duckdb::Connection::Connection(local_3a8,local_8);
  local_3b0 = (CreateFunctionInfo *)
              duckdb::shared_ptr<duckdb::ClientContext,_true>::operator*
                        ((shared_ptr<duckdb::ClientContext,_true> *)pSVar28);
  local_3b8 = (ClientContext *)duckdb::Catalog::GetSystemCatalog((ClientContext *)local_3b0);
  duckdb::Connection::BeginTransaction();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3d8,"hello",&local_3d9);
  local_428 = local_420;
  duckdb::LogicalType::LogicalType(local_428,VARCHAR);
  local_408 = local_420;
  local_400 = 1;
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x151425);
  iVar12._M_len = (size_type)pfVar31;
  iVar12._M_array = pLVar29;
  duckdb::vector<duckdb::LogicalType,_true>::vector
            ((vector<duckdb::LogicalType,_true> *)pSVar28,iVar12,(allocator_type *)__x);
  duckdb::LogicalType::LogicalType(local_448,INTEGER);
  duckdb::Connection::CreateScalarFunction<int,duckdb::string_t>
            (in_stack_ffffffffffffce80,in_stack_ffffffffffffce78,in_stack_ffffffffffffce70,
             in_stack_ffffffffffffce68,in_stack_ffffffffffffce60);
  duckdb::LogicalType::~LogicalType(local_448);
  duckdb::vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x1514a8);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x1514b5);
  local_2d80 = (LogicalType *)&local_408;
  do {
    local_2d80 = local_2d80 + -0x18;
    duckdb::LogicalType::~LogicalType(local_2d80);
  } while (local_2d80 != local_420);
  std::__cxx11::string::~string(local_3d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
  local_450 = duckdb::Catalog::CreateFunction(local_3b8,local_3b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_470,"POINT",&local_471);
  std::allocator<char>::~allocator((allocator<char> *)&local_471);
  duckdb::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
            *)0x1515a5);
  pVar26 = std::make_pair<char_const(&)[2],duckdb::LogicalTypeId_const&>
                     ((char (*) [2])pSVar28,(LogicalTypeId *)__x);
  local_4e8 = pVar26.first;
  local_4e0 = pVar26.second;
  local_4d8 = local_4e8;
  local_4d0 = local_4e0;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  ::pair<const_char_*,_duckdb::LogicalTypeId,_true>(in_stack_ffffffffffffcdc0,__p);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               *)pSVar28,__x);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
           *)pSVar28);
  pVar26 = std::make_pair<char_const(&)[2],duckdb::LogicalTypeId_const&>
                     ((char (*) [2])pSVar28,(LogicalTypeId *)__x);
  local_540 = pVar26.first;
  local_538 = pVar26.second;
  local_530 = local_540;
  local_528 = local_538;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  ::pair<const_char_*,_duckdb::LogicalTypeId,_true>(in_stack_ffffffffffffcdc0,__p);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               *)pSVar28,__x);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
           *)pSVar28);
  duckdb::make_uniq<duckdb::CreateTypeInfo>();
  pCVar24 = duckdb::
            unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>::
            operator->((unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>
                        *)pSVar28);
  pCVar24[0x52] = (CreateTypeInfo)0x1;
  pCVar24 = duckdb::
            unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>::
            operator->((unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>
                        *)pSVar28);
  std::__cxx11::string::operator=((string *)(pCVar24 + 0x128),local_470);
  duckdb::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
            *)pSVar28,
           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
            *)__x);
  duckdb::LogicalType::STRUCT(local_560,local_578);
  duckdb::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
             *)0x15177d);
  std::__cxx11::string::string(local_598,local_470);
  duckdb::LogicalType::SetAlias(local_560,local_598);
  std::__cxx11::string::~string(local_598);
  duckdb::unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>::
  operator->((unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>
              *)pSVar28);
  duckdb::LogicalType::operator=(pLVar29,(LogicalType *)pSVar28);
  pCVar22 = local_3b0;
  pCVar21 = local_3b8;
  duckdb::unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>::
  operator*((unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true> *
            )pSVar28);
  local_5a0 = duckdb::Catalog::CreateType(pCVar21,(CreateTypeInfo *)pCVar22);
  duckdb::optional_ptr<duckdb::CatalogEntry,_true>::operator->
            ((optional_ptr<duckdb::CatalogEntry,_true> *)pSVar28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5c0,"ext:name",&local_5c1);
  pmVar25 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)pSVar28,&__x->first);
  std::__cxx11::string::operator=((string *)pmVar25,"loadable_extension_demo");
  std::__cxx11::string::~string(local_5c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
  duckdb::optional_ptr<duckdb::CatalogEntry,_true>::operator->
            ((optional_ptr<duckdb::CatalogEntry,_true> *)pSVar28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5e8,"ext:author",&local_5e9);
  pmVar25 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)pSVar28,&__x->first);
  std::__cxx11::string::operator=((string *)pmVar25,"DuckDB Labs");
  std::__cxx11::string::~string(local_5e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_738,"add_point",&local_739);
  local_7a0 = local_798;
  duckdb::LogicalType::LogicalType(local_7a0,local_560);
  local_7a0 = local_780;
  duckdb::LogicalType::LogicalType(local_7a0,local_560);
  local_768 = local_798;
  local_760 = 2;
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x151a5b);
  iVar13._M_len = (size_type)pfVar31;
  iVar13._M_array = pLVar29;
  duckdb::vector<duckdb::LogicalType,_true>::vector
            ((vector<duckdb::LogicalType,_true> *)pSVar28,iVar13,(allocator_type *)__x);
  duckdb::LogicalType::LogicalType(local_7c0,local_560);
  std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            (pfVar31,(_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)pLVar29);
  duckdb::LogicalType::LogicalType((LogicalType *)&local_7f8,INVALID);
  pfVar31 = &local_7f8;
  uVar35 = 0;
  uVar34 = 0;
  uVar33 = 0;
  pLVar29 = (iterator)0x0;
  pSVar28 = (ScalarFunction *)0x0;
  paVar27 = (allocator_type *)0x0;
  duckdb::ScalarFunction::ScalarFunction
            (&local_718,local_738,local_758,local_7c0,&local_7f8._M_invoker,0);
  duckdb::LogicalType::~LogicalType((LogicalType *)&local_7f8);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::~function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             0x151b48);
  duckdb::LogicalType::~LogicalType(local_7c0);
  duckdb::vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x151b62);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x151b6f);
  local_2e50 = (LogicalType *)&local_768;
  do {
    local_2e50 = local_2e50 + -0x18;
    duckdb::LogicalType::~LogicalType(local_2e50);
  } while (local_2e50 != local_798);
  std::__cxx11::string::~string(local_738);
  std::allocator<char>::~allocator((allocator<char> *)&local_739);
  duckdb::ScalarFunction::ScalarFunction
            ((ScalarFunction *)CONCAT44(in_stack_ffffffffffffcdb4,uVar34),
             (ScalarFunction *)CONCAT44(in_stack_ffffffffffffcdac,uVar33));
  SVar2._8_8_ = pSVar28;
  SVar2._0_8_ = paVar27;
  SVar2._16_8_ = pLVar29;
  SVar2._24_8_ = pfVar31;
  SVar2._32_4_ = uVar33;
  SVar2._36_4_ = in_stack_ffffffffffffcdac;
  SVar2._40_4_ = uVar34;
  SVar2._44_4_ = in_stack_ffffffffffffcdb4;
  SVar2._48_8_ = uVar35;
  SVar2._56_8_ = in_stack_ffffffffffffcdc0;
  SVar2._64_116_ = in_stack_ffffffffffffcdc8;
  SVar2.function.super__Function_base._M_functor._4_4_ = in_stack_ffffffffffffce3c;
  SVar2._184_32_ = in_stack_ffffffffffffce40;
  SVar2.bind_extended = (bind_scalar_function_extended_t)in_stack_ffffffffffffce60;
  SVar2.init_local_state = (init_local_state_t)in_stack_ffffffffffffce68;
  SVar2.statistics = (function_statistics_t)in_stack_ffffffffffffce70;
  SVar2.bind_lambda = (bind_lambda_function_t)in_stack_ffffffffffffce78;
  SVar2.bind_expression = (function_bind_expression_t)in_stack_ffffffffffffce80;
  SVar2.get_modified_databases = (get_modified_databases_t)in_stack_ffffffffffffce88._0_8_;
  SVar2.serialize = (function_serialize_t)in_stack_ffffffffffffce88._8_8_;
  SVar2.deserialize = (function_deserialize_t)in_stack_ffffffffffffce88._16_8_;
  SVar2.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2> =
       (original)(original)in_stack_ffffffffffffce88._24_16_;
  duckdb::CreateScalarFunctionInfo::CreateScalarFunctionInfo(local_9b0,SVar2);
  duckdb::ScalarFunction::~ScalarFunction(pSVar28);
  local_ae0 = duckdb::Catalog::CreateFunction(local_3b8,local_3b0);
  duckdb::optional_ptr<duckdb::CatalogEntry,_true>::operator->
            ((optional_ptr<duckdb::CatalogEntry,_true> *)pSVar28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b00,"ext:name",&local_b01);
  pmVar25 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)pSVar28,(key_type *)paVar27);
  std::__cxx11::string::operator=((string *)pmVar25,"loadable_extension_demo");
  std::__cxx11::string::~string(local_b00);
  std::allocator<char>::~allocator((allocator<char> *)&local_b01);
  duckdb::optional_ptr<duckdb::CatalogEntry,_true>::operator->
            ((optional_ptr<duckdb::CatalogEntry,_true> *)pSVar28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b28,"ext:author",&local_b29);
  pmVar25 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)pSVar28,(key_type *)paVar27);
  std::__cxx11::string::operator=((string *)pmVar25,"DuckDB Labs");
  std::__cxx11::string::~string(local_b28);
  std::allocator<char>::~allocator((allocator<char> *)&local_b29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c78,"sub_point",&local_c79);
  local_ce0 = local_cd8;
  duckdb::LogicalType::LogicalType(local_ce0,local_560);
  local_ce0 = local_cc0;
  duckdb::LogicalType::LogicalType(local_ce0,local_560);
  local_ca8 = local_cd8;
  local_ca0 = 2;
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x151e4d);
  iVar14._M_len = (size_type)pfVar31;
  iVar14._M_array = pLVar29;
  duckdb::vector<duckdb::LogicalType,_true>::vector
            ((vector<duckdb::LogicalType,_true> *)pSVar28,iVar14,paVar27);
  duckdb::LogicalType::LogicalType(local_d00,local_560);
  std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            (pfVar31,(_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)pLVar29);
  duckdb::LogicalType::LogicalType((LogicalType *)&local_d38,INVALID);
  pfVar31 = &local_d38;
  uVar35 = 0;
  uVar34 = 0;
  uVar33 = 0;
  __f = (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)0x0;
  pSVar28 = (ScalarFunction *)0x0;
  __k = (key_type *)0x0;
  duckdb::ScalarFunction::ScalarFunction
            (&local_c58,local_c78,local_c98,local_d00,&local_d38._M_invoker,0);
  duckdb::LogicalType::~LogicalType((LogicalType *)&local_d38);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::~function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             0x151f3a);
  duckdb::LogicalType::~LogicalType(local_d00);
  duckdb::vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x151f54);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x151f61);
  local_2ec0 = (LogicalType *)&local_ca8;
  do {
    local_2ec0 = local_2ec0 + -0x18;
    duckdb::LogicalType::~LogicalType(local_2ec0);
  } while (local_2ec0 != local_cd8);
  std::__cxx11::string::~string(local_c78);
  std::allocator<char>::~allocator((allocator<char> *)&local_c79);
  duckdb::ScalarFunction::ScalarFunction
            ((ScalarFunction *)CONCAT44(in_stack_ffffffffffffcdb4,uVar34),
             (ScalarFunction *)CONCAT44(in_stack_ffffffffffffcdac,uVar33));
  SVar3._8_8_ = pSVar28;
  SVar3._0_8_ = __k;
  SVar3._16_8_ = __f;
  SVar3._24_8_ = pfVar31;
  SVar3._32_4_ = uVar33;
  SVar3._36_4_ = in_stack_ffffffffffffcdac;
  SVar3._40_4_ = uVar34;
  SVar3._44_4_ = in_stack_ffffffffffffcdb4;
  SVar3._48_8_ = uVar35;
  SVar3._56_8_ = in_stack_ffffffffffffcdc0;
  SVar3._64_116_ = in_stack_ffffffffffffcdc8;
  SVar3.function.super__Function_base._M_functor._4_4_ = in_stack_ffffffffffffce3c;
  SVar3._184_32_ = in_stack_ffffffffffffce40;
  SVar3.bind_extended = (bind_scalar_function_extended_t)in_stack_ffffffffffffce60;
  SVar3.init_local_state = (init_local_state_t)in_stack_ffffffffffffce68;
  SVar3.statistics = (function_statistics_t)in_stack_ffffffffffffce70;
  SVar3.bind_lambda = (bind_lambda_function_t)in_stack_ffffffffffffce78;
  SVar3.bind_expression = (function_bind_expression_t)in_stack_ffffffffffffce80;
  SVar3.get_modified_databases = (get_modified_databases_t)in_stack_ffffffffffffce88._0_8_;
  SVar3.serialize = (function_serialize_t)in_stack_ffffffffffffce88._8_8_;
  SVar3.deserialize = (function_deserialize_t)in_stack_ffffffffffffce88._16_8_;
  SVar3.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2> =
       (original)(original)in_stack_ffffffffffffce88._24_16_;
  duckdb::CreateScalarFunctionInfo::CreateScalarFunctionInfo(local_ef0,SVar3);
  duckdb::ScalarFunction::~ScalarFunction(pSVar28);
  local_1020 = duckdb::Catalog::CreateFunction(local_3b8,local_3b0);
  duckdb::optional_ptr<duckdb::CatalogEntry,_true>::operator->
            ((optional_ptr<duckdb::CatalogEntry,_true> *)pSVar28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1040,"ext:name",&local_1041);
  pmVar25 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)pSVar28,__k);
  std::__cxx11::string::operator=((string *)pmVar25,"loadable_extension_demo");
  std::__cxx11::string::~string(local_1040);
  std::allocator<char>::~allocator((allocator<char> *)&local_1041);
  duckdb::optional_ptr<duckdb::CatalogEntry,_true>::operator->
            ((optional_ptr<duckdb::CatalogEntry,_true> *)pSVar28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1068,"ext:author",&local_1069);
  pmVar25 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)pSVar28,__k);
  std::__cxx11::string::operator=((string *)pmVar25,"DuckDB Labs");
  std::__cxx11::string::~string(local_1068);
  std::allocator<char>::~allocator((allocator<char> *)&local_1069);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_11b8,"loaded_extensions",&local_11b9);
  local_11d8 = 0;
  uStack_11d0 = 0;
  local_11c8 = 0;
  duckdb::vector<duckdb::LogicalType,_true>::vector((vector<duckdb::LogicalType,_true> *)0x1521f4);
  duckdb::LogicalType::LogicalType((LogicalType *)(local_1228 + 0x38),VARCHAR);
  std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>(pfVar31,__f);
  duckdb::LogicalType::LogicalType((LogicalType *)local_1228,INVALID);
  this_01 = (TableFunction *)local_1228;
  uVar35 = 0;
  uVar34 = 0;
  uVar33 = 0;
  __f_00 = (TableFunction *)0x0;
  this_00 = (TableFunction *)0x0;
  __x_00 = (value_type *)0x0;
  duckdb::ScalarFunction::ScalarFunction
            (&local_1198,local_11b8,&local_11d8,local_1228 + 0x38,local_1228 + 0x18,0);
  duckdb::LogicalType::~LogicalType((LogicalType *)local_1228);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::~function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             0x1522b7);
  duckdb::LogicalType::~LogicalType((LogicalType *)(local_1228 + 0x38));
  duckdb::vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x1522d1);
  std::__cxx11::string::~string(local_11b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_11b9);
  duckdb::ScalarFunction::ScalarFunction
            ((ScalarFunction *)CONCAT44(in_stack_ffffffffffffcdb4,uVar34),
             (ScalarFunction *)CONCAT44(in_stack_ffffffffffffcdac,uVar33));
  SVar4._8_8_ = this_00;
  SVar4._0_8_ = __x_00;
  SVar4._16_8_ = __f_00;
  SVar4._24_8_ = this_01;
  SVar4._32_4_ = uVar33;
  SVar4._36_4_ = in_stack_ffffffffffffcdac;
  SVar4._40_4_ = uVar34;
  SVar4._44_4_ = in_stack_ffffffffffffcdb4;
  SVar4._48_8_ = uVar35;
  SVar4._56_8_ = in_stack_ffffffffffffcdc0;
  SVar4._64_116_ = in_stack_ffffffffffffcdc8;
  SVar4.function.super__Function_base._M_functor._4_4_ = in_stack_ffffffffffffce3c;
  SVar4._184_32_ = in_stack_ffffffffffffce40;
  SVar4.bind_extended = (bind_scalar_function_extended_t)in_stack_ffffffffffffce60;
  SVar4.init_local_state = (init_local_state_t)in_stack_ffffffffffffce68;
  SVar4.statistics = (function_statistics_t)in_stack_ffffffffffffce70;
  SVar4.bind_lambda = (bind_lambda_function_t)in_stack_ffffffffffffce78;
  SVar4.bind_expression = (function_bind_expression_t)in_stack_ffffffffffffce80;
  SVar4.get_modified_databases = (get_modified_databases_t)in_stack_ffffffffffffce88._0_8_;
  SVar4.serialize = (function_serialize_t)in_stack_ffffffffffffce88._8_8_;
  SVar4.deserialize = (function_deserialize_t)in_stack_ffffffffffffce88._16_8_;
  SVar4.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2> =
       (original)(original)in_stack_ffffffffffffce88._24_16_;
  duckdb::CreateScalarFunctionInfo::CreateScalarFunctionInfo(local_13e0,SVar4);
  duckdb::ScalarFunction::~ScalarFunction((ScalarFunction *)this_00);
  local_1510 = duckdb::Catalog::CreateFunction(local_3b8,local_3b0);
  QuackFunction::QuackFunction((QuackFunction *)in_stack_ffffffffffffcdc0);
  duckdb::TableFunction::TableFunction(this_01,__f_00);
  TVar11._8_8_ = this_00;
  TVar11._0_8_ = __x_00;
  TVar11._16_8_ = __f_00;
  TVar11._24_8_ = this_01;
  TVar11._32_4_ = uVar33;
  TVar11._36_4_ = in_stack_ffffffffffffcdac;
  TVar11._40_4_ = uVar34;
  TVar11._44_4_ = in_stack_ffffffffffffcdb4;
  TVar11._48_8_ = uVar35;
  TVar11._56_8_ = in_stack_ffffffffffffcdc0;
  TVar11._64_116_ = in_stack_ffffffffffffcdc8;
  TVar11._180_4_ = in_stack_ffffffffffffce3c;
  TVar11._184_32_ = in_stack_ffffffffffffce40;
  TVar11.bind_operator = (table_function_bind_operator_t)in_stack_ffffffffffffce60;
  TVar11.init_global = (table_function_init_global_t)in_stack_ffffffffffffce68;
  TVar11.init_local = (table_function_init_local_t)in_stack_ffffffffffffce70;
  TVar11.function = (table_function_t)in_stack_ffffffffffffce78;
  TVar11.in_out_function = (table_in_out_function_t)in_stack_ffffffffffffce80;
  TVar11.in_out_function_final = (table_in_out_function_final_t)in_stack_ffffffffffffce88._0_8_;
  TVar11.statistics = (table_statistics_t)in_stack_ffffffffffffce88._8_8_;
  TVar11.dependency = (table_function_dependency_t)in_stack_ffffffffffffce88._16_8_;
  TVar11.cardinality = (table_function_cardinality_t)in_stack_ffffffffffffce88._24_8_;
  TVar11.pushdown_complex_filter =
       (table_function_pushdown_complex_filter_t)in_stack_ffffffffffffce88._32_8_;
  TVar11.pushdown_expression = (table_function_pushdown_expression_t)in_stack_ffffffffffffceb0._0_8_
  ;
  TVar11.to_string = (table_function_to_string_t)in_stack_ffffffffffffceb0._8_8_;
  TVar11.dynamic_to_string = (table_function_dynamic_to_string_t)in_stack_ffffffffffffceb0._16_8_;
  TVar11.table_scan_progress = (table_function_progress_t)in_stack_ffffffffffffceb0._24_8_;
  TVar11.get_partition_data = (table_function_get_partition_data_t)in_stack_ffffffffffffceb0._32_8_;
  TVar11.get_bind_info = (table_function_get_bind_info_t)in_stack_ffffffffffffceb0._40_8_;
  TVar11.type_pushdown = (table_function_type_pushdown_t)in_stack_ffffffffffffceb0._48_8_;
  TVar11.get_multi_file_reader =
       (table_function_get_multi_file_reader_t)in_stack_ffffffffffffceb0._56_8_;
  TVar11.supports_pushdown_type =
       (table_function_supports_pushdown_type_t)in_stack_ffffffffffffceb0._64_8_;
  TVar11.get_partition_info = (table_function_get_partition_info_t)in_stack_ffffffffffffceb0._72_8_;
  TVar11.get_partition_stats =
       (table_function_get_partition_stats_t)in_stack_ffffffffffffceb0._80_8_;
  TVar11.get_virtual_columns =
       (table_function_get_virtual_columns_t)in_stack_ffffffffffffceb0._88_8_;
  TVar11.serialize = (table_function_serialize_t)in_stack_ffffffffffffceb0._96_8_;
  TVar11.deserialize = (table_function_deserialize_t)in_stack_ffffffffffffceb0._104_8_;
  TVar11.verify_serialization = (bool)in_stack_ffffffffffffceb0[0x70];
  TVar11.projection_pushdown = (bool)in_stack_ffffffffffffceb0[0x71];
  TVar11.filter_pushdown = (bool)in_stack_ffffffffffffceb0[0x72];
  TVar11.filter_prune = (bool)in_stack_ffffffffffffceb0[0x73];
  TVar11.sampling_pushdown = (bool)in_stack_ffffffffffffceb0[0x74];
  TVar11.late_materialization = (bool)in_stack_ffffffffffffceb0[0x75];
  TVar11._414_2_ = in_stack_ffffffffffffceb0._118_2_;
  TVar11.function_info.internal.
  super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_stack_ffffffffffffcf28;
  TVar11.function_info.internal.
  super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_stack_ffffffffffffcf30;
  TVar11._432_8_ = in_stack_ffffffffffffcf38;
  duckdb::CreateTableFunctionInfo::CreateTableFunctionInfo(local_1880,TVar11);
  duckdb::TableFunction::~TableFunction(this_00);
  local_1a40 = duckdb::Catalog::CreateTableFunction(local_3b8,(CreateTableFunctionInfo *)local_3b0);
  duckdb::Connection::Commit();
  local_1a48 = duckdb::DBConfig::GetConfig(local_8);
  QuackExtension::QuackExtension((QuackExtension *)this_00);
  std::vector<duckdb::ParserExtension,_std::allocator<duckdb::ParserExtension>_>::push_back
            ((vector<duckdb::ParserExtension,_std::allocator<duckdb::ParserExtension>_> *)this_00,
             __x_00);
  QuackExtension::~QuackExtension((QuackExtension *)0x15245d);
  duckdb::make_uniq<QuackLoadExtension>();
  duckdb::unique_ptr<duckdb::ExtensionCallback,std::default_delete<duckdb::ExtensionCallback>,true>
  ::
  unique_ptr<QuackLoadExtension,std::default_delete<std::unique_ptr<duckdb::ExtensionCallback,std::default_delete<duckdb::ExtensionCallback>>>,void>
            ((unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>
              *)this_00,
             (unique_ptr<QuackLoadExtension,_std::default_delete<QuackLoadExtension>_> *)__x_00);
  std::
  vector<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>_>_>
  ::push_back((vector<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>_>_>
               *)this_00,(value_type *)__x_00);
  duckdb::
  unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>::
  ~unique_ptr((unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>
               *)0x1524c3);
  duckdb::unique_ptr<QuackLoadExtension,_std::default_delete<QuackLoadExtension>,_true>::~unique_ptr
            ((unique_ptr<QuackLoadExtension,_std::default_delete<QuackLoadExtension>,_true> *)
             0x1524d0);
  BoundedType::GetDefault();
  pDVar23 = local_8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1ab0,"BOUNDED",&local_1ab1);
  duckdb::LogicalType::LogicalType(local_1ad0,local_1a90);
  duckdb::ExtensionUtil::RegisterType(pDVar23,local_1ab0,local_1ad0,BoundedType::Bind);
  duckdb::LogicalType::~LogicalType(local_1ad0);
  std::__cxx11::string::~string(local_1ab0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1ab1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c18,"bounded_max",&local_1c19);
  local_1c68 = local_1c60;
  duckdb::LogicalType::LogicalType(local_1c68,local_1a90);
  local_1c48 = local_1c60;
  local_1c40 = 1;
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x152609);
  iVar15._M_len = (size_type)this_01;
  iVar15._M_array = (iterator)__f_00;
  duckdb::vector<duckdb::LogicalType,_true>::vector
            ((vector<duckdb::LogicalType,_true> *)this_00,iVar15,(allocator_type *)__x_00);
  duckdb::LogicalType::LogicalType(local_1c88,INTEGER);
  std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             this_01,(_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)__f_00);
  duckdb::LogicalType::LogicalType((LogicalType *)&local_1cc0,INVALID);
  pfVar31 = &local_1cc0;
  uVar35 = 0;
  uVar34 = 0;
  uVar33 = 0;
  pLVar29 = (iterator)0x0;
  pSVar28 = (ScalarFunction *)0x0;
  paVar27 = (allocator_type *)0x0;
  duckdb::ScalarFunction::ScalarFunction
            (&local_1bf8,local_1c18,local_1c38,local_1c88,&local_1cc0._M_invoker,BoundedMaxBind);
  duckdb::LogicalType::~LogicalType((LogicalType *)&local_1cc0);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::~function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             0x1526f5);
  duckdb::LogicalType::~LogicalType(local_1c88);
  duckdb::vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x15270f);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x15271c);
  local_2f78 = (LogicalType *)&local_1c48;
  do {
    local_2f78 = local_2f78 + -0x18;
    duckdb::LogicalType::~LogicalType(local_2f78);
  } while (local_2f78 != local_1c60);
  std::__cxx11::string::~string(local_1c18);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c19);
  pDVar23 = local_8;
  duckdb::ScalarFunction::ScalarFunction
            ((ScalarFunction *)CONCAT44(in_stack_ffffffffffffcdb4,uVar34),
             (ScalarFunction *)CONCAT44(in_stack_ffffffffffffcdac,uVar33));
  SVar5._8_8_ = pSVar28;
  SVar5._0_8_ = paVar27;
  SVar5._16_8_ = pLVar29;
  SVar5._24_8_ = pfVar31;
  SVar5._32_4_ = uVar33;
  SVar5._36_4_ = in_stack_ffffffffffffcdac;
  SVar5._40_4_ = uVar34;
  SVar5._44_4_ = in_stack_ffffffffffffcdb4;
  SVar5._48_8_ = uVar35;
  SVar5._56_8_ = in_stack_ffffffffffffcdc0;
  SVar5._64_116_ = in_stack_ffffffffffffcdc8;
  SVar5.function.super__Function_base._M_functor._4_4_ = in_stack_ffffffffffffce3c;
  SVar5._184_32_ = in_stack_ffffffffffffce40;
  SVar5.bind_extended = (bind_scalar_function_extended_t)in_stack_ffffffffffffce60;
  SVar5.init_local_state = (init_local_state_t)in_stack_ffffffffffffce68;
  SVar5.statistics = (function_statistics_t)in_stack_ffffffffffffce70;
  SVar5.bind_lambda = (bind_lambda_function_t)in_stack_ffffffffffffce78;
  SVar5.bind_expression = (function_bind_expression_t)in_stack_ffffffffffffce80;
  SVar5.get_modified_databases = (get_modified_databases_t)in_stack_ffffffffffffce88._0_8_;
  SVar5.serialize = (function_serialize_t)in_stack_ffffffffffffce88._8_8_;
  SVar5.deserialize = (function_deserialize_t)in_stack_ffffffffffffce88._16_8_;
  SVar5.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2> =
       (original)(original)in_stack_ffffffffffffce88._24_16_;
  duckdb::ExtensionUtil::RegisterFunction(pDVar23,SVar5);
  duckdb::ScalarFunction::~ScalarFunction(pSVar28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f30,"bounded_invert",&local_1f31);
  local_1f80 = local_1f78;
  duckdb::LogicalType::LogicalType(local_1f80,local_1a90);
  local_1f60 = local_1f78;
  local_1f58 = 1;
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x152856);
  iVar16._M_len = (size_type)pfVar31;
  iVar16._M_array = pLVar29;
  duckdb::vector<duckdb::LogicalType,_true>::vector
            ((vector<duckdb::LogicalType,_true> *)pSVar28,iVar16,paVar27);
  duckdb::LogicalType::LogicalType(local_1fa0,local_1a90);
  std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            (pfVar31,(_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)pLVar29);
  duckdb::LogicalType::LogicalType((LogicalType *)&local_1fd8,INVALID);
  pfVar31 = &local_1fd8;
  uVar35 = 0;
  uVar34 = 0;
  uVar33 = 0;
  pLVar29 = (iterator)0x0;
  pSVar28 = (ScalarFunction *)0x0;
  paVar27 = (allocator_type *)0x0;
  duckdb::ScalarFunction::ScalarFunction
            (local_1f10,local_1f30,local_1f50,local_1fa0,&local_1fd8._M_invoker,BoundedInvertBind);
  duckdb::LogicalType::~LogicalType((LogicalType *)&local_1fd8);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::~function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             0x152945);
  duckdb::LogicalType::~LogicalType(local_1fa0);
  duckdb::vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x15295f);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x15296c);
  local_2fa8 = (LogicalType *)&local_1f60;
  do {
    local_2fa8 = local_2fa8 + -0x18;
    duckdb::LogicalType::~LogicalType(local_2fa8);
  } while (local_2fa8 != local_1f78);
  std::__cxx11::string::~string(local_1f30);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f31);
  pDVar23 = local_8;
  duckdb::ScalarFunction::ScalarFunction
            ((ScalarFunction *)CONCAT44(in_stack_ffffffffffffcdb4,uVar34),
             (ScalarFunction *)CONCAT44(in_stack_ffffffffffffcdac,uVar33));
  SVar6._8_8_ = pSVar28;
  SVar6._0_8_ = paVar27;
  SVar6._16_8_ = pLVar29;
  SVar6._24_8_ = pfVar31;
  SVar6._32_4_ = uVar33;
  SVar6._36_4_ = in_stack_ffffffffffffcdac;
  SVar6._40_4_ = uVar34;
  SVar6._44_4_ = in_stack_ffffffffffffcdb4;
  SVar6._48_8_ = uVar35;
  SVar6._56_8_ = in_stack_ffffffffffffcdc0;
  SVar6._64_116_ = in_stack_ffffffffffffcdc8;
  SVar6.function.super__Function_base._M_functor._4_4_ = in_stack_ffffffffffffce3c;
  SVar6._184_32_ = in_stack_ffffffffffffce40;
  SVar6.bind_extended = (bind_scalar_function_extended_t)in_stack_ffffffffffffce60;
  SVar6.init_local_state = (init_local_state_t)in_stack_ffffffffffffce68;
  SVar6.statistics = (function_statistics_t)in_stack_ffffffffffffce70;
  SVar6.bind_lambda = (bind_lambda_function_t)in_stack_ffffffffffffce78;
  SVar6.bind_expression = (function_bind_expression_t)in_stack_ffffffffffffce80;
  SVar6.get_modified_databases = (get_modified_databases_t)in_stack_ffffffffffffce88._0_8_;
  SVar6.serialize = (function_serialize_t)in_stack_ffffffffffffce88._8_8_;
  SVar6.deserialize = (function_deserialize_t)in_stack_ffffffffffffce88._16_8_;
  SVar6.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2> =
       (original)(original)in_stack_ffffffffffffce88._24_16_;
  duckdb::ExtensionUtil::RegisterFunction(pDVar23,SVar6);
  duckdb::ScalarFunction::~ScalarFunction(pSVar28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2248,"bounded_add",&local_2249);
  local_22b0 = local_22a8;
  duckdb::LogicalType::LogicalType(local_22b0,local_1a90);
  local_22b0 = local_2290;
  duckdb::LogicalType::LogicalType(local_22b0,local_1a90);
  local_2278 = local_22a8;
  local_2270 = 2;
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x152ac5);
  iVar17._M_len = (size_type)pfVar31;
  iVar17._M_array = pLVar29;
  duckdb::vector<duckdb::LogicalType,_true>::vector
            ((vector<duckdb::LogicalType,_true> *)pSVar28,iVar17,paVar27);
  duckdb::LogicalType::LogicalType(local_22d0,local_1a90);
  std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            (pfVar31,(_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)pLVar29);
  duckdb::LogicalType::LogicalType((LogicalType *)&local_2308,INVALID);
  pfVar31 = &local_2308;
  uVar35 = 0;
  uVar34 = 0;
  uVar33 = 0;
  pLVar29 = (iterator)0x0;
  pSVar28 = (ScalarFunction *)0x0;
  paVar27 = (allocator_type *)0x0;
  duckdb::ScalarFunction::ScalarFunction
            (local_2228,local_2248,local_2268,local_22d0,&local_2308._M_invoker,BoundedAddBind);
  duckdb::LogicalType::~LogicalType((LogicalType *)&local_2308);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::~function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             0x152bb4);
  duckdb::LogicalType::~LogicalType(local_22d0);
  duckdb::vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x152bce);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x152bdb);
  local_2fd8 = (LogicalType *)&local_2278;
  do {
    local_2fd8 = local_2fd8 + -0x18;
    duckdb::LogicalType::~LogicalType(local_2fd8);
  } while (local_2fd8 != local_22a8);
  std::__cxx11::string::~string(local_2248);
  std::allocator<char>::~allocator((allocator<char> *)&local_2249);
  pDVar23 = local_8;
  duckdb::ScalarFunction::ScalarFunction
            ((ScalarFunction *)CONCAT44(in_stack_ffffffffffffcdb4,uVar34),
             (ScalarFunction *)CONCAT44(in_stack_ffffffffffffcdac,uVar33));
  SVar7._8_8_ = pSVar28;
  SVar7._0_8_ = paVar27;
  SVar7._16_8_ = pLVar29;
  SVar7._24_8_ = pfVar31;
  SVar7._32_4_ = uVar33;
  SVar7._36_4_ = in_stack_ffffffffffffcdac;
  SVar7._40_4_ = uVar34;
  SVar7._44_4_ = in_stack_ffffffffffffcdb4;
  SVar7._48_8_ = uVar35;
  SVar7._56_8_ = in_stack_ffffffffffffcdc0;
  SVar7._64_116_ = in_stack_ffffffffffffcdc8;
  SVar7.function.super__Function_base._M_functor._4_4_ = in_stack_ffffffffffffce3c;
  SVar7._184_32_ = in_stack_ffffffffffffce40;
  SVar7.bind_extended = (bind_scalar_function_extended_t)in_stack_ffffffffffffce60;
  SVar7.init_local_state = (init_local_state_t)in_stack_ffffffffffffce68;
  SVar7.statistics = (function_statistics_t)in_stack_ffffffffffffce70;
  SVar7.bind_lambda = (bind_lambda_function_t)in_stack_ffffffffffffce78;
  SVar7.bind_expression = (function_bind_expression_t)in_stack_ffffffffffffce80;
  SVar7.get_modified_databases = (get_modified_databases_t)in_stack_ffffffffffffce88._0_8_;
  SVar7.serialize = (function_serialize_t)in_stack_ffffffffffffce88._8_8_;
  SVar7.deserialize = (function_deserialize_t)in_stack_ffffffffffffce88._16_8_;
  SVar7.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2> =
       (original)(original)in_stack_ffffffffffffce88._24_16_;
  duckdb::ExtensionUtil::RegisterFunction(pDVar23,SVar7);
  duckdb::ScalarFunction::~ScalarFunction(pSVar28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2578,"bounded_even",&local_2579);
  local_25c8 = local_25c0;
  duckdb::LogicalType::LogicalType(local_25c8,local_1a90);
  local_25a8 = local_25c0;
  local_25a0 = 1;
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x152d15);
  iVar18._M_len = (size_type)pfVar31;
  iVar18._M_array = pLVar29;
  duckdb::vector<duckdb::LogicalType,_true>::vector
            ((vector<duckdb::LogicalType,_true> *)pSVar28,iVar18,paVar27);
  duckdb::LogicalType::LogicalType(local_25e8,BOOLEAN);
  std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            (pfVar31,(_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)pLVar29);
  duckdb::LogicalType::LogicalType((LogicalType *)&local_2620,INVALID);
  pfVar31 = &local_2620;
  uVar35 = 0;
  uVar34 = 0;
  uVar33 = 0;
  pLVar29 = (iterator)0x0;
  pSVar28 = (ScalarFunction *)0x0;
  paVar27 = (allocator_type *)0x0;
  duckdb::ScalarFunction::ScalarFunction
            (local_2558,local_2578,local_2598,local_25e8,&local_2620._M_invoker,0);
  duckdb::LogicalType::~LogicalType((LogicalType *)&local_2620);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::~function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             0x152dff);
  duckdb::LogicalType::~LogicalType(local_25e8);
  duckdb::vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x152e19);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x152e26);
  local_3008 = (LogicalType *)&local_25a8;
  do {
    local_3008 = local_3008 + -0x18;
    duckdb::LogicalType::~LogicalType(local_3008);
  } while (local_3008 != local_25c0);
  std::__cxx11::string::~string(local_2578);
  std::allocator<char>::~allocator((allocator<char> *)&local_2579);
  pDVar23 = local_8;
  duckdb::ScalarFunction::ScalarFunction
            ((ScalarFunction *)CONCAT44(in_stack_ffffffffffffcdb4,uVar34),
             (ScalarFunction *)CONCAT44(in_stack_ffffffffffffcdac,uVar33));
  SVar8._8_8_ = pSVar28;
  SVar8._0_8_ = paVar27;
  SVar8._16_8_ = pLVar29;
  SVar8._24_8_ = pfVar31;
  SVar8._32_4_ = uVar33;
  SVar8._36_4_ = in_stack_ffffffffffffcdac;
  SVar8._40_4_ = uVar34;
  SVar8._44_4_ = in_stack_ffffffffffffcdb4;
  SVar8._48_8_ = uVar35;
  SVar8._56_8_ = in_stack_ffffffffffffcdc0;
  SVar8._64_116_ = in_stack_ffffffffffffcdc8;
  SVar8.function.super__Function_base._M_functor._4_4_ = in_stack_ffffffffffffce3c;
  SVar8._184_32_ = in_stack_ffffffffffffce40;
  SVar8.bind_extended = (bind_scalar_function_extended_t)in_stack_ffffffffffffce60;
  SVar8.init_local_state = (init_local_state_t)in_stack_ffffffffffffce68;
  SVar8.statistics = (function_statistics_t)in_stack_ffffffffffffce70;
  SVar8.bind_lambda = (bind_lambda_function_t)in_stack_ffffffffffffce78;
  SVar8.bind_expression = (function_bind_expression_t)in_stack_ffffffffffffce80;
  SVar8.get_modified_databases = (get_modified_databases_t)in_stack_ffffffffffffce88._0_8_;
  SVar8.serialize = (function_serialize_t)in_stack_ffffffffffffce88._8_8_;
  SVar8.deserialize = (function_deserialize_t)in_stack_ffffffffffffce88._16_8_;
  SVar8.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2> =
       (original)(original)in_stack_ffffffffffffce88._24_16_;
  duckdb::ExtensionUtil::RegisterFunction(pDVar23,SVar8);
  duckdb::ScalarFunction::~ScalarFunction(pSVar28);
  BoundedType::Get(in_stack_ffffffffffffce3c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28a8,"bounded_ascii",&local_28a9);
  local_28f8 = local_28f0;
  duckdb::LogicalType::LogicalType(local_28f8,local_2760);
  local_28d8 = local_28f0;
  local_28d0 = 1;
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x152f74);
  iVar19._M_len = (size_type)pfVar31;
  iVar19._M_array = pLVar29;
  duckdb::vector<duckdb::LogicalType,_true>::vector
            ((vector<duckdb::LogicalType,_true> *)pSVar28,iVar19,paVar27);
  duckdb::LogicalType::LogicalType(local_2918,VARCHAR);
  std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            (pfVar31,(_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)pLVar29);
  duckdb::LogicalType::LogicalType((LogicalType *)&local_2950,INVALID);
  pfVar31 = &local_2950;
  uVar35 = 0;
  uVar34 = 0;
  uVar33 = 0;
  pLVar29 = (iterator)0x0;
  pSVar28 = (ScalarFunction *)0x0;
  paVar27 = (allocator_type *)0x0;
  duckdb::ScalarFunction::ScalarFunction
            (&local_2888,local_28a8,local_28c8,local_2918,&local_2950._M_invoker,0);
  duckdb::LogicalType::~LogicalType((LogicalType *)&local_2950);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::~function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             0x15305e);
  duckdb::LogicalType::~LogicalType(local_2918);
  duckdb::vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x153078);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x153085);
  local_3038 = (LogicalType *)&local_28d8;
  do {
    local_3038 = local_3038 + -0x18;
    duckdb::LogicalType::~LogicalType(local_3038);
  } while (local_3038 != local_28f0);
  std::__cxx11::string::~string(local_28a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_28a9);
  pDVar23 = local_8;
  duckdb::ScalarFunction::ScalarFunction
            ((ScalarFunction *)CONCAT44(in_stack_ffffffffffffcdb4,uVar34),
             (ScalarFunction *)CONCAT44(in_stack_ffffffffffffcdac,uVar33));
  SVar9._8_8_ = pSVar28;
  SVar9._0_8_ = paVar27;
  SVar9._16_8_ = pLVar29;
  SVar9._24_8_ = pfVar31;
  SVar9._32_4_ = uVar33;
  SVar9._36_4_ = in_stack_ffffffffffffcdac;
  SVar9._40_4_ = uVar34;
  SVar9._44_4_ = in_stack_ffffffffffffcdb4;
  SVar9._48_8_ = uVar35;
  SVar9._56_8_ = in_stack_ffffffffffffcdc0;
  SVar9._64_116_ = in_stack_ffffffffffffcdc8;
  SVar9.function.super__Function_base._M_functor._4_4_ = in_stack_ffffffffffffce3c;
  SVar9._184_32_ = in_stack_ffffffffffffce40;
  SVar9.bind_extended = (bind_scalar_function_extended_t)in_stack_ffffffffffffce60;
  SVar9.init_local_state = (init_local_state_t)in_stack_ffffffffffffce68;
  SVar9.statistics = (function_statistics_t)in_stack_ffffffffffffce70;
  SVar9.bind_lambda = (bind_lambda_function_t)in_stack_ffffffffffffce78;
  SVar9.bind_expression = (function_bind_expression_t)in_stack_ffffffffffffce80;
  SVar9.get_modified_databases = (get_modified_databases_t)in_stack_ffffffffffffce88._0_8_;
  SVar9.serialize = (function_serialize_t)in_stack_ffffffffffffce88._8_8_;
  SVar9.deserialize = (function_deserialize_t)in_stack_ffffffffffffce88._16_8_;
  SVar9.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2> =
       (original)(original)in_stack_ffffffffffffce88._24_16_;
  duckdb::ExtensionUtil::RegisterFunction(pDVar23,SVar9);
  duckdb::ScalarFunction::~ScalarFunction(pSVar28);
  pDVar23 = local_8;
  duckdb::unique_ptr<duckdb::BoundCastData,std::default_delete<duckdb::BoundCastData>,true>::
  unique_ptr<std::default_delete<duckdb::BoundCastData>,void>
            ((unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true> *)
             pSVar28,paVar27);
  duckdb::BoundCastInfo::BoundCastInfo(local_2a90,BoundedToBoundedCast,local_2a98,0);
  duckdb::ExtensionUtil::RegisterCastFunction(pDVar23,local_1a90,local_2760,local_2a90,0);
  duckdb::BoundCastInfo::~BoundCastInfo((BoundCastInfo *)0x1531cc);
  duckdb::unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>::
  ~unique_ptr((unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true> *
              )0x1531d9);
  pDVar23 = local_8;
  duckdb::LogicalType::LogicalType(local_2ab0,INTEGER);
  duckdb::unique_ptr<duckdb::BoundCastData,std::default_delete<duckdb::BoundCastData>,true>::
  unique_ptr<std::default_delete<duckdb::BoundCastData>,void>
            ((unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true> *)
             pSVar28,paVar27);
  duckdb::BoundCastInfo::BoundCastInfo(local_2ac8,IntToBoundedCast,local_2ad0,0);
  duckdb::ExtensionUtil::RegisterCastFunction(pDVar23,local_2ab0,local_1a90,local_2ac8,0);
  duckdb::BoundCastInfo::~BoundCastInfo((BoundCastInfo *)0x15327d);
  duckdb::unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>::
  ~unique_ptr((unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true> *
              )0x15328a);
  duckdb::LogicalType::~LogicalType(local_2ab0);
  MinMaxType::GetDefault();
  pDVar23 = local_8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2b08,"MINMAX",&local_2b09);
  duckdb::LogicalType::LogicalType(local_2b28,local_2ae8);
  duckdb::ExtensionUtil::RegisterType(pDVar23,local_2b08,local_2b28,MinMaxType::Bind);
  duckdb::LogicalType::~LogicalType(local_2b28);
  std::__cxx11::string::~string(local_2b08);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b09);
  pDVar23 = local_8;
  duckdb::LogicalType::LogicalType(local_2b40,INTEGER);
  duckdb::unique_ptr<duckdb::BoundCastData,std::default_delete<duckdb::BoundCastData>,true>::
  unique_ptr<std::default_delete<duckdb::BoundCastData>,void>
            ((unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true> *)
             pSVar28,paVar27);
  duckdb::BoundCastInfo::BoundCastInfo(local_2b58,IntToMinMaxCast,local_2b60,0);
  duckdb::ExtensionUtil::RegisterCastFunction(pDVar23,local_2b40,local_2ae8,local_2b58,0);
  duckdb::BoundCastInfo::~BoundCastInfo((BoundCastInfo *)0x1533f1);
  duckdb::unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>::
  ~unique_ptr((unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true> *
              )0x1533fe);
  duckdb::LogicalType::~LogicalType(local_2b40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2ca8,"minmax_range",&local_2ca9);
  local_2cf8 = local_2cf0;
  duckdb::LogicalType::LogicalType(local_2cf8,local_2ae8);
  local_2cd8 = local_2cf0;
  local_2cd0 = 1;
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x15349e);
  iVar20._M_len = (size_type)pfVar31;
  iVar20._M_array = pLVar29;
  duckdb::vector<duckdb::LogicalType,_true>::vector
            ((vector<duckdb::LogicalType,_true> *)pSVar28,iVar20,paVar27);
  duckdb::LogicalType::LogicalType(local_2d18,INTEGER);
  std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            (pfVar31,(_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)pLVar29);
  duckdb::LogicalType::LogicalType(local_2d50,INVALID);
  pLVar32 = local_2d50;
  uVar36 = 0;
  uVar34 = 0;
  uVar33 = 0;
  uVar30 = 0;
  pSVar28 = (ScalarFunction *)0x0;
  uVar35 = 0;
  duckdb::ScalarFunction::ScalarFunction(&local_2c88,local_2ca8,local_2cc8,local_2d18,local_2d38,0);
  SVar10._8_8_ = pSVar28;
  SVar10._0_8_ = uVar35;
  SVar10._16_8_ = uVar30;
  SVar10._24_8_ = pLVar32;
  SVar10._32_4_ = uVar33;
  SVar10._36_4_ = in_stack_ffffffffffffcdac;
  SVar10._40_4_ = uVar34;
  SVar10._44_4_ = in_stack_ffffffffffffcdb4;
  SVar10._48_8_ = uVar36;
  SVar10._56_8_ = in_stack_ffffffffffffcdc0;
  SVar10._64_116_ = in_stack_ffffffffffffcdc8;
  SVar10.function.super__Function_base._M_functor._4_4_ = in_stack_ffffffffffffce3c;
  SVar10._184_32_ = in_stack_ffffffffffffce40;
  SVar10.bind_extended = (bind_scalar_function_extended_t)in_stack_ffffffffffffce60;
  SVar10.init_local_state = (init_local_state_t)in_stack_ffffffffffffce68;
  SVar10.statistics = (function_statistics_t)in_stack_ffffffffffffce70;
  SVar10.bind_lambda = (bind_lambda_function_t)in_stack_ffffffffffffce78;
  SVar10.bind_expression = (function_bind_expression_t)in_stack_ffffffffffffce80;
  SVar10.get_modified_databases = (get_modified_databases_t)in_stack_ffffffffffffce88._0_8_;
  SVar10.serialize = (function_serialize_t)in_stack_ffffffffffffce88._8_8_;
  SVar10.deserialize = (function_deserialize_t)in_stack_ffffffffffffce88._16_8_;
  SVar10.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2> =
       (original)(original)in_stack_ffffffffffffce88._24_16_;
  duckdb::ExtensionUtil::RegisterFunction(local_8,SVar10);
  duckdb::ScalarFunction::~ScalarFunction(pSVar28);
  duckdb::LogicalType::~LogicalType(local_2d50);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::~function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             0x1535ac);
  duckdb::LogicalType::~LogicalType(local_2d18);
  duckdb::vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x1535c6);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x1535d3);
  pLVar32 = local_2cf0;
  this = (LogicalType *)&local_2cd8;
  do {
    this = this + -0x18;
    duckdb::LogicalType::~LogicalType(this);
  } while (this != pLVar32);
  std::__cxx11::string::~string(local_2ca8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2ca9);
  duckdb::LogicalType::~LogicalType(local_2ae8);
  duckdb::ScalarFunction::~ScalarFunction(pSVar28);
  duckdb::LogicalType::~LogicalType(local_2760);
  duckdb::ScalarFunction::~ScalarFunction(pSVar28);
  duckdb::ScalarFunction::~ScalarFunction(pSVar28);
  duckdb::ScalarFunction::~ScalarFunction(pSVar28);
  duckdb::ScalarFunction::~ScalarFunction(pSVar28);
  duckdb::LogicalType::~LogicalType(local_1a90);
  duckdb::CreateTableFunctionInfo::~CreateTableFunctionInfo((CreateTableFunctionInfo *)pSVar28);
  QuackFunction::~QuackFunction((QuackFunction *)0x1536c1);
  duckdb::CreateScalarFunctionInfo::~CreateScalarFunctionInfo((CreateScalarFunctionInfo *)pSVar28);
  duckdb::ScalarFunction::~ScalarFunction(pSVar28);
  duckdb::CreateScalarFunctionInfo::~CreateScalarFunctionInfo((CreateScalarFunctionInfo *)pSVar28);
  duckdb::ScalarFunction::~ScalarFunction(pSVar28);
  duckdb::CreateScalarFunctionInfo::~CreateScalarFunctionInfo((CreateScalarFunctionInfo *)pSVar28);
  duckdb::ScalarFunction::~ScalarFunction(pSVar28);
  duckdb::LogicalType::~LogicalType(local_560);
  duckdb::unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>::
  ~unique_ptr((unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>
               *)0x153729);
  duckdb::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
             *)0x153736);
  std::__cxx11::string::~string(local_470);
  duckdb::Connection::~Connection(local_3a8);
  duckdb::CreateScalarFunctionInfo::~CreateScalarFunctionInfo((CreateScalarFunctionInfo *)pSVar28);
  return;
}

Assistant:

DUCKDB_EXTENSION_API void loadable_extension_demo_init(duckdb::DatabaseInstance &db) {
	CreateScalarFunctionInfo hello_alias_info(
	    ScalarFunction("test_alias_hello", {}, LogicalType::VARCHAR, TestAliasHello));

	// create a scalar function
	Connection con(db);
	auto &client_context = *con.context;
	auto &catalog = Catalog::GetSystemCatalog(client_context);
	con.BeginTransaction();
	con.CreateScalarFunction<int32_t, string_t>("hello", {LogicalType(LogicalTypeId::VARCHAR)},
	                                            LogicalType(LogicalTypeId::INTEGER), &hello_fun);
	catalog.CreateFunction(client_context, hello_alias_info);

	// Add alias POINT type
	string alias_name = "POINT";
	child_list_t<LogicalType> child_types;
	child_types.push_back(make_pair("x", LogicalType::INTEGER));
	child_types.push_back(make_pair("y", LogicalType::INTEGER));
	auto alias_info = make_uniq<CreateTypeInfo>();
	alias_info->internal = true;
	alias_info->name = alias_name;
	LogicalType target_type = LogicalType::STRUCT(child_types);
	target_type.SetAlias(alias_name);
	alias_info->type = target_type;

	auto type_entry = catalog.CreateType(client_context, *alias_info);
	type_entry->tags["ext:name"] = "loadable_extension_demo";
	type_entry->tags["ext:author"] = "DuckDB Labs";

	// Function add point
	ScalarFunction add_point_func("add_point", {target_type, target_type}, target_type, AddPointFunction);
	CreateScalarFunctionInfo add_point_info(add_point_func);
	auto add_point_entry = catalog.CreateFunction(client_context, add_point_info);
	add_point_entry->tags["ext:name"] = "loadable_extension_demo";
	add_point_entry->tags["ext:author"] = "DuckDB Labs";

	// Function sub point
	ScalarFunction sub_point_func("sub_point", {target_type, target_type}, target_type, SubPointFunction);
	CreateScalarFunctionInfo sub_point_info(sub_point_func);
	auto sub_point_entry = catalog.CreateFunction(client_context, sub_point_info);
	sub_point_entry->tags["ext:name"] = "loadable_extension_demo";
	sub_point_entry->tags["ext:author"] = "DuckDB Labs";

	// Function sub point
	ScalarFunction loaded_extensions("loaded_extensions", {}, LogicalType::VARCHAR, LoadedExtensionsFunction);
	CreateScalarFunctionInfo loaded_extensions_info(loaded_extensions);
	catalog.CreateFunction(client_context, loaded_extensions_info);

	// Quack function
	QuackFunction quack_function;
	CreateTableFunctionInfo quack_info(quack_function);
	catalog.CreateTableFunction(client_context, quack_info);

	con.Commit();

	// add a parser extension
	auto &config = DBConfig::GetConfig(db);
	config.parser_extensions.push_back(QuackExtension());
	config.extension_callbacks.push_back(make_uniq<QuackLoadExtension>());

	// Bounded type
	auto bounded_type = BoundedType::GetDefault();
	ExtensionUtil::RegisterType(db, "BOUNDED", bounded_type, BoundedType::Bind);

	// Example of function inspecting the type property
	ScalarFunction bounded_max("bounded_max", {bounded_type}, LogicalType::INTEGER, BoundedMaxFunc, BoundedMaxBind);
	ExtensionUtil::RegisterFunction(db, bounded_max);

	// Example of function inspecting the type property and returning the same type
	ScalarFunction bounded_invert("bounded_invert", {bounded_type}, bounded_type, BoundedInvertFunc, BoundedInvertBind);
	// bounded_invert.serialize = BoundedReturnSerialize;
	// bounded_invert.deserialize = BoundedReturnDeserialize;
	ExtensionUtil::RegisterFunction(db, bounded_invert);

	// Example of function inspecting the type property of both arguments and returning a new type
	ScalarFunction bounded_add("bounded_add", {bounded_type, bounded_type}, bounded_type, BoundedAddFunc,
	                           BoundedAddBind);
	ExtensionUtil::RegisterFunction(db, bounded_add);

	// Example of function that is generic over the type property (the bound is not important)
	ScalarFunction bounded_even("bounded_even", {bounded_type}, LogicalType::BOOLEAN, BoundedEvenFunc);
	ExtensionUtil::RegisterFunction(db, bounded_even);

	// Example of function that is specialized over type property
	auto bounded_specialized_type = BoundedType::Get(0xFF);
	ScalarFunction bounded_to_ascii("bounded_ascii", {bounded_specialized_type}, LogicalType::VARCHAR,
	                                BoundedToAsciiFunc);
	ExtensionUtil::RegisterFunction(db, bounded_to_ascii);

	// Enable explicit casting to our specialized type
	ExtensionUtil::RegisterCastFunction(db, bounded_type, bounded_specialized_type, BoundCastInfo(BoundedToBoundedCast),
	                                    0);
	// Casts
	ExtensionUtil::RegisterCastFunction(db, LogicalType::INTEGER, bounded_type, BoundCastInfo(IntToBoundedCast), 0);

	// MinMax Type
	auto minmax_type = MinMaxType::GetDefault();
	ExtensionUtil::RegisterType(db, "MINMAX", minmax_type, MinMaxType::Bind);
	ExtensionUtil::RegisterCastFunction(db, LogicalType::INTEGER, minmax_type, BoundCastInfo(IntToMinMaxCast), 0);
	ExtensionUtil::RegisterFunction(
	    db, ScalarFunction("minmax_range", {minmax_type}, LogicalType::INTEGER, MinMaxRangeFunc));
}